

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_echo_server.cpp
# Opt level: O0

void __thiscall EchoServer::~EchoServer(EchoServer *this)

{
  EchoServer *this_local;
  
  sznet::net::LengthHeaderCodec<std::shared_ptr<sznet::net::TcpConnection>_>::~LengthHeaderCodec
            (&this->m_codec);
  sznet::net::TcpServer::~TcpServer(&this->m_server);
  return;
}

Assistant:

EchoServer(EventLoop* loop, const InetAddress& listenAddr, int mode = 1) : 
        m_server(loop, listenAddr, "EchoServer"),
        m_transferred(0),
        m_receivedMessages(0),
        m_oldCounter(0),
        m_startTime(Timestamp::now()),
        m_codec(std::bind(&EchoServer::onMessage, this, std::placeholders::_1, std::placeholders::_2, std::placeholders::_3)),
        m_mode(mode)
    {
        m_server.setConnectionCallback(
            std::bind(&EchoServer::onConnection, this, std::placeholders::_1));
        m_server.setMessageCallback(std::bind(&LengthHeaderCodec<>::onMessage, &m_codec,
            std::placeholders::_1, std::placeholders::_2, std::placeholders::_3));
        m_server.setThreadNum(numThreads);
        if (m_mode == 1)
        {
            loop->runEvery(3.0, std::bind(&EchoServer::printThroughput, this));
        }
    }